

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  stbtt__buf fontdict;
  stbtt_uint32 sVar12;
  ulong uVar13;
  uint uVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uchar *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float dx3;
  stbtt__buf sVar38;
  stbtt__buf b;
  ulong uVar39;
  undefined4 in_stack_fffffffffffffdc0;
  int iVar40;
  stbtt__buf local_238;
  float local_228;
  int local_224;
  uchar *puVar41;
  ulong uVar42;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar41 = (info->subrs).data;
  local_108.cursor = (info->subrs).cursor;
  local_108.size = (info->subrs).size;
  local_238 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar18 = local_238._8_8_;
  uVar13 = uVar18 >> 0x20;
  if (local_238.size <= local_238.cursor) {
switchD_0015f797_default:
    return 0;
  }
  local_108.data = puVar41;
  local_e8 = (ulong)(uint)glyph_index;
  uVar20 = (ulong)(glyph_index + 1);
  local_e0 = &(info->gsubrs).cursor;
  iVar40 = 1;
  uVar42 = 0;
  puVar41 = (uchar *)0x0;
  uVar29 = 0;
  local_224 = 0;
  uVar39 = uVar20;
LAB_0015f3f0:
  fVar37 = s[9];
  dx3 = s[8];
  fVar36 = s[7];
  fVar32 = s[6];
  fVar35 = s[5];
  fVar34 = s[4];
  fVar33 = s[2];
  iVar22 = (int)uVar18;
  uVar18 = (long)iVar22 + 1;
  iVar23 = (int)uVar18;
  local_238.cursor = iVar23;
  bVar11 = local_238.data[iVar22];
  uVar14 = (uint)uVar29;
  iVar30 = (int)uVar13;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    uVar42 = (ulong)(uint)((int)uVar42 + ((int)((int)(uVar29 >> 0x1f) + uVar14) >> 1));
    goto LAB_0015faa1;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0015f424_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_0015f536;
  case 0x1c:
    if ((iVar22 < 0) || (iVar30 < iVar22)) {
LAB_00160050:
      __assert_fail("!(o > b->size || o < 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                    ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
    }
    local_238.cursor = iVar22;
    sVar12 = stbtt__cff_int(&local_238);
    fVar33 = (float)(int)(short)sVar12;
LAB_0015f56d:
    if (0x2f < (int)uVar14) {
      return 0;
    }
    uVar29 = (ulong)(uVar14 + 1);
    s[(int)uVar14] = fVar33;
    goto LAB_0016001b;
  case 4:
    if ((int)uVar14 < 1) {
      return 0;
    }
    fVar33 = s[uVar14 - 1];
    fVar34 = 0.0;
    goto LAB_0015fa63;
  case 5:
    if ((int)uVar14 < 2) {
      return 0;
    }
    uVar13 = 1;
    uVar20 = uVar39;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar33 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar13 - 1));
      fVar34 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar13 - 1)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar29);
    break;
  case 6:
    iVar30 = 0;
    uVar20 = uVar39;
    if ((int)uVar14 < 1) {
      return 0;
    }
    for (; iVar30 < (int)uVar14; iVar30 = iVar30 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar33 = s[iVar30];
      c->x = fVar33 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar33 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar30 = iVar30 + 1;
LAB_0015ffbd:
      if ((int)uVar14 <= iVar30) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar33 = s[iVar30];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar33 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar33 + (float)uVar10),0,0,0,0);
    }
    break;
  case 7:
    iVar30 = 0;
    uVar20 = uVar39;
    if (0 < (int)uVar14) goto LAB_0015ffbd;
    return 0;
  case 8:
    if ((int)uVar14 < 6) {
      return 0;
    }
    uVar13 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)((long)&uStack_1e0 + uVar13 * 4 + 4),
                 *(float *)((long)&local_1d8 + uVar13 * 4),
                 *(float *)((long)&local_1d8 + uVar13 * 4 + 4),s[uVar13 - 2],s[uVar13 - 1],s[uVar13]
                );
      uVar13 = uVar13 + 6;
    } while (uVar13 < uVar29);
    goto LAB_0015faa1;
  case 10:
    iVar30 = 1;
    if (local_224 == 0) {
      uVar16 = (info->fdselect).size;
      if (uVar16 != 0) {
        if ((int)uVar16 < 0) goto LAB_00160050;
        puVar24 = (info->fdselect).data;
        if (*puVar24 == '\0') {
          if (uVar16 < (uint)uVar20) goto LAB_00160050;
          uVar17 = 0;
          if ((uint)uVar20 < uVar16) {
            uVar17 = (uint)puVar24[uVar20];
          }
        }
        else {
          if (*puVar24 == '\x03') {
            uVar21 = 0;
            iVar23 = 1;
            iVar30 = 2;
            do {
              if (iVar23 < (int)uVar16) {
                lVar28 = (long)iVar23;
                iVar23 = iVar23 + 1;
                uVar17 = (uint)puVar24[lVar28];
              }
              else {
                uVar17 = 0;
              }
              uVar21 = uVar21 << 8 | uVar17;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            uVar25 = 0;
            iVar30 = 2;
            do {
              if (iVar23 < (int)uVar16) {
                lVar28 = (long)iVar23;
                iVar23 = iVar23 + 1;
                uVar17 = (uint)puVar24[lVar28];
              }
              else {
                uVar17 = 0;
              }
              uVar25 = uVar25 << 8 | uVar17;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            if (0 < (int)uVar21) {
              uVar26 = 0;
              do {
                if (iVar23 < (int)uVar16) {
                  lVar28 = (long)iVar23;
                  iVar23 = iVar23 + 1;
                  uVar17 = (uint)puVar24[lVar28];
                }
                else {
                  uVar17 = 0;
                }
                uVar27 = 0;
                iVar30 = 2;
                do {
                  if (iVar23 < (int)uVar16) {
                    lVar28 = (long)iVar23;
                    iVar23 = iVar23 + 1;
                    uVar19 = (uint)puVar24[lVar28];
                  }
                  else {
                    uVar19 = 0;
                  }
                  uVar27 = uVar27 << 8 | uVar19;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
                if ((int)local_e8 < (int)uVar27 && (int)uVar25 <= (int)local_e8) goto LAB_0015fd3e;
                uVar26 = uVar26 + 1;
                uVar25 = uVar27;
              } while (uVar26 != uVar21);
            }
          }
          uVar17 = 0xffffffff;
        }
LAB_0015fd3e:
        stbtt__cff_index_get(info->fontdicts,uVar17);
        sVar38.cursor = in_stack_fffffffffffffdc0;
        sVar38.data = (uchar *)uVar39;
        sVar38.size = iVar40;
        fontdict.cursor = (int)uVar42;
        fontdict.size = (int)(uVar42 >> 0x20);
        fontdict.data = puVar41;
        local_108 = stbtt__get_subrs(sVar38,fontdict);
        iVar30 = 1;
      }
    }
    goto LAB_0015fd85;
  case 0xb:
    if ((int)puVar41 < 1) {
      return 0;
    }
    puVar41 = (uchar *)(ulong)((int)puVar41 - 1);
    local_238.data._4_4_ = *(undefined4 *)((long)&subr_stack[(long)puVar41].data + 4);
    local_238.data._0_4_ = *(undefined4 *)&subr_stack[(long)puVar41].data;
    local_238.cursor = subr_stack[(long)puVar41].cursor;
    local_238.size = subr_stack[(long)puVar41].size;
    goto LAB_0016001b;
  case 0xc:
    if (iVar30 <= iVar23) {
      return 0;
    }
    local_238.cursor = iVar22 + 2;
    switch(local_238.data[uVar18]) {
    case '\"':
      if ((int)uVar14 < 7) {
        return 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar37 = -fVar33;
      fVar36 = 0.0;
      fVar33 = 0.0;
      dx3 = (float)local_1d8;
      break;
    case '#':
      if ((int)uVar14 < 0xd) {
        return 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,s[6]);
      local_f8 = s[10];
      local_228 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar34 = (float)local_1d8;
      fVar33 = local_228;
      fVar35 = dx3;
      dx3 = local_f8;
      break;
    case '$':
      if ((int)uVar14 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_228 = s[3];
      local_1d8 = CONCAT44(local_1d8._4_4_,s[5]);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar34 = (float)local_1d8;
      fVar37 = fVar36;
      fVar33 = -(local_f8 + local_228 + fVar36);
      fVar35 = fVar32;
      fVar36 = 0.0;
      break;
    case '%':
      if ((int)uVar14 < 0xb) {
        return 0;
      }
      local_1d8 = CONCAT44(s[9],s[8]);
      uStack_1e0 = 0;
      uStack_1d0 = 0;
      fVar33 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar35 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar34 = ABS(fVar33);
      fVar37 = ABS(fVar35);
      dx3 = s[10];
      if (fVar34 <= fVar37) {
        dx3 = -fVar33;
      }
      uVar14 = -(uint)(fVar37 < fVar34);
      uVar16 = ~uVar14 & (uint)s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar34 = fVar32;
      fVar37 = local_1d8._4_4_;
      fVar33 = (float)(uVar16 | (uint)-fVar35 & uVar14);
      fVar35 = (float)local_1d8;
      break;
    default:
      goto switchD_0015f797_default;
    }
    goto LAB_0015f74e;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar40 != 0) {
      uVar42 = (ulong)(uint)((int)uVar42 + ((int)((int)(uVar29 >> 0x1f) + uVar14) >> 1));
    }
    iVar22 = (int)uVar42 + 7;
    iVar40 = (int)uVar42 + 0xe;
    if (-1 < iVar22) {
      iVar40 = iVar22;
    }
    iVar23 = (iVar40 >> 3) + iVar23;
    if ((iVar23 < 0) || (iVar30 < iVar23)) goto LAB_00160050;
    local_238.cursor = iVar23;
    goto LAB_0015fa99;
  case 0x15:
    if ((int)uVar14 < 2) {
      return 0;
    }
    fVar34 = s[uVar14 - 2];
    fVar33 = s[uVar14 - 1];
    goto LAB_0015fa63;
  case 0x16:
    if ((int)uVar14 < 1) {
      return 0;
    }
    fVar34 = s[uVar14 - 1];
    fVar33 = 0.0;
LAB_0015fa63:
    stbtt__csctx_rmove_to(c,fVar34,fVar33);
LAB_0015fa99:
    iVar40 = 0;
LAB_0015faa1:
    uVar29 = 0;
    goto LAB_0016001b;
  case 0x18:
    if ((int)uVar14 < 8) {
      return 0;
    }
    lVar28 = -6;
    do {
      lVar31 = lVar28;
      stbtt__csctx_rccurve_to
                (c,s[lVar31 + 6],s[lVar31 + 7],s[lVar31 + 8],s[lVar31 + 9],s[lVar31 + 10],
                 s[lVar31 + 0xb]);
      lVar28 = lVar31 + 6;
    } while (lVar31 + 6 < (long)(uVar29 - 0xd));
    if ((int)uVar14 <= (int)lVar31 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar33 = (float)uVar3 + (float)*(undefined8 *)(s + lVar31 + 0xc);
    fVar34 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar31 + 0xc) >> 0x20);
    c->x = fVar33;
    c->y = fVar34;
    stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
    uVar20 = uVar39;
    break;
  case 0x19:
    if ((int)uVar14 < 8) {
      return 0;
    }
    uVar13 = 2;
    do {
      uVar18 = uVar13;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar33 = (float)uVar1 + (float)*(undefined8 *)(s + (uVar18 - 2));
      fVar34 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + (uVar18 - 2)) >> 0x20);
      c->x = fVar33;
      c->y = fVar34;
      stbtt__csctx_v(c,'\x02',(int)fVar33,(int)fVar34,0,0,0,0);
      uVar13 = uVar18 + 2;
    } while (uVar18 + 1 < (ulong)(uVar14 - 6));
    if ((int)uVar14 <= (int)(uVar18 + 5)) {
      return 0;
    }
    fVar34 = s[uVar18];
    fVar37 = s[(int)uVar13 + 1];
    fVar33 = s[uVar18 + 5 & 0xffffffff];
    fVar35 = s[uVar13 & 0xffffffff];
    fVar36 = s[uVar18 + 1];
    dx3 = s[(int)uVar13 + 2];
LAB_0015f74e:
    stbtt__csctx_rccurve_to(c,fVar34,fVar36,fVar35,fVar37,dx3,fVar33);
    uVar20 = uVar39;
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar14 < 4) {
      return 0;
    }
    uVar13 = (ulong)(uVar14 & 1);
    uVar20 = uVar39;
    if ((uVar14 & 1) + 3 < uVar14) {
      fVar33 = 0.0;
      if ((uVar29 & 1) != 0) {
        fVar33 = s[0];
      }
      do {
        iVar30 = (int)uVar13;
        fVar34 = s[uVar13];
        if (bVar11 == 0x1b) {
          fVar32 = fVar34;
          fVar36 = 0.0;
          fVar35 = s[iVar30 + 3];
          fVar34 = fVar33;
        }
        else {
          fVar35 = 0.0;
          fVar32 = fVar33;
          fVar36 = s[iVar30 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar32,fVar34,s[uVar13 + 1],s[uVar13 + 2],fVar35,fVar36);
        uVar13 = uVar13 + 4;
        fVar33 = 0.0;
      } while (iVar30 + 7 < (int)uVar14);
    }
    break;
  case 0x1d:
    iVar30 = local_224;
LAB_0015fd85:
    uVar20 = uVar39;
    if ((int)uVar14 < 1) {
      return 0;
    }
    iVar23 = (int)puVar41;
    if (9 < iVar23) {
      return 0;
    }
    uVar29 = (ulong)(uVar14 - 1);
    fVar33 = s[uVar29];
    *(undefined4 *)&subr_stack[iVar23].data = local_238.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar23].data + 4) = local_238.data._4_4_;
    subr_stack[iVar23].cursor = local_238.cursor;
    subr_stack[iVar23].size = local_238.size;
    piVar15 = &local_108.cursor;
    puVar24 = local_108.data;
    if (bVar11 != 10) {
      puVar24 = (info->gsubrs).data;
      piVar15 = local_e0;
    }
    uVar13 = *(ulong *)piVar15;
    if ((long)uVar13 < 0) goto LAB_00160050;
    puVar41 = (uchar *)(ulong)(iVar23 + 1);
    uVar16 = 0;
    iVar23 = 2;
    uVar14 = 0;
    do {
      if ((int)uVar16 < (int)(uVar13 >> 0x20)) {
        lVar28 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        uVar17 = (uint)puVar24[lVar28];
      }
      else {
        uVar17 = 0;
      }
      uVar14 = uVar14 << 8 | uVar17;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    uVar17 = (uint)(0x4d7 < (int)uVar14) << 10 | 0x6b;
    if (0x846b < (int)uVar14) {
      uVar17 = 0x8000;
    }
    iVar23 = uVar17 + (int)fVar33;
    sVar38 = (stbtt__buf)ZEXT816(0);
    uVar39 = uVar20;
    if (iVar23 < (int)uVar14 && -1 < iVar23) {
      b._8_8_ = (ulong)uVar16 | uVar13 & 0x7fffffff00000000;
      b.data = puVar24;
      sVar38 = stbtt__cff_index_get(b,iVar23);
    }
    if (sVar38._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_238.size = sVar38.size;
    local_238.data = sVar38.data;
    local_238.cursor = 0;
    local_224 = iVar30;
    goto LAB_0016001b;
  case 0x1e:
    iVar23 = 0;
    if ((int)uVar14 < 4) {
      return 0;
    }
    while (uVar20 = uVar39, iVar23 + 3 < (int)uVar14) {
      iVar30 = iVar23 + 4;
      fVar33 = 0.0;
      if (uVar14 - iVar23 == 5) {
        fVar33 = s[iVar30];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar23],s[(long)iVar23 + 1],s[(long)iVar23 + 2],s[iVar23 + 3],fVar33);
LAB_0015ff0f:
      uVar20 = uVar39;
      if ((int)uVar14 <= iVar30 + 3) break;
      iVar23 = iVar30 + 4;
      fVar33 = 0.0;
      if (uVar14 - iVar30 == 5) {
        fVar33 = s[iVar23];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar30],0.0,s[(long)iVar30 + 1],s[(long)iVar30 + 2],fVar33,s[iVar30 + 3]);
    }
    break;
  case 0x1f:
    iVar30 = 0;
    if (3 < (int)uVar14) goto LAB_0015ff0f;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_0015f424_caseD_2;
LAB_0015f536:
    uVar16 = 0;
    iVar23 = 4;
    do {
      iVar22 = (int)uVar18;
      if (iVar22 < iVar30) {
        uVar18 = (ulong)(iVar22 + 1);
        uVar17 = (uint)local_238.data[iVar22];
      }
      else {
        uVar17 = 0;
      }
      uVar16 = uVar16 << 8 | uVar17;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    local_238.cursor = (int)uVar18;
    fVar33 = (float)(int)uVar16 * 1.5258789e-05;
    goto LAB_0015f56d;
  }
  uVar29 = 0;
  uVar39 = uVar20;
LAB_0016001b:
  uVar18 = (ulong)(uint)local_238.cursor;
  uVar13 = (ulong)(uint)local_238.size;
  if (local_238.size <= local_238.cursor) {
    return 0;
  }
  goto LAB_0015f3f0;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}